

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall QAbstractSpinBox::mousePressEvent(QAbstractSpinBox *this,QMouseEvent *event)

{
  QAbstractSpinBoxPrivate *this_00;
  ulong uVar1;
  bool up;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSpinBoxPrivate **)(this + 8);
  (this_00->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i = *(Int *)(event + 0x20);
  if ((*(int *)(event + 0x40) == 1) && (this_00->buttonState == 0)) {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_28 = QPointF::toPoint(&local_38);
    QAbstractSpinBoxPrivate::updateHoverControl(this_00,&local_28);
    event[0xc] = (QMouseEvent)0x1;
    if (this_00->buttonSymbols != NoButtons) {
      uVar1 = (**(code **)(*(long *)this + 0x1c8))(this);
      if (((uVar1 & 1) == 0) || (this_00->hoverControl != SC_ComboBoxFrame)) {
        if (((uVar1 & 2) == 0) || (this_00->hoverControl != SC_ComboBoxEditField))
        goto LAB_0043fdb6;
        up = false;
      }
      else {
        up = true;
      }
      QAbstractSpinBoxPrivate::updateState(this_00,up,false);
      goto LAB_0043fdbb;
    }
  }
LAB_0043fdb6:
  event[0xc] = (QMouseEvent)0x0;
LAB_0043fdbb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::mousePressEvent(QMouseEvent *event)
{
    Q_D(QAbstractSpinBox);

    d->keyboardModifiers = event->modifiers();
    if (event->button() != Qt::LeftButton || d->buttonState != None) {
        event->ignore();
        return;
    }

    d->updateHoverControl(event->position().toPoint());
    event->accept();

    const StepEnabled se = (d->buttonSymbols == NoButtons) ? StepEnabled(StepNone) : stepEnabled();
    if ((se & StepUpEnabled) && d->hoverControl == QStyle::SC_SpinBoxUp) {
        d->updateState(true);
    } else if ((se & StepDownEnabled) && d->hoverControl == QStyle::SC_SpinBoxDown) {
        d->updateState(false);
    } else {
        event->ignore();
    }
}